

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O2

int main(int32 argc,char **argv)

{
  float32 fVar1;
  float32 *__ptr;
  float32 **tmpptr;
  uint uVar2;
  int iVar3;
  int iVar4;
  s3wid_t w;
  int32 logb_p;
  cmd_ln_t *config;
  char *pcVar5;
  FILE *pFVar6;
  ps_decoder_t *ps;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  FILE *pFVar10;
  FILE *pFVar11;
  char *pcVar12;
  char *pcVar13;
  logmath_t *plVar14;
  ps_mllr_t *mllr;
  ps_mllr_t *ppVar15;
  logmath_t *lmath;
  fsg_model_t *fsg;
  size_t sVar16;
  size_t sVar17;
  long lVar18;
  ps_seg_t *ppVar19;
  ps_lattice_t *dag;
  ps_config_t *ppVar20;
  ps_nbest_t *nbest;
  ulong uVar21;
  FILE *__stream;
  double dVar22;
  float64 fVar23;
  int32 sf;
  double local_170;
  FILE *local_168;
  FILE *local_160;
  float32 **local_158;
  FILE *local_150;
  uint local_148;
  int32 ef;
  char *local_140;
  char *local_138;
  FILE *local_130;
  char *local_128;
  logmath_t *local_120;
  uint local_114;
  FILE *local_110;
  FILE *local_108;
  FILE *local_100;
  char *local_f8;
  double n_wall;
  double n_cpu;
  double n_speech;
  size_t len;
  int local_cc;
  uint local_c8;
  int32 ascr;
  char *local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  char *local_a0;
  char *local_98;
  size_t local_90;
  double local_88;
  char *local_80;
  FILE *local_78;
  FILE *local_70;
  FILE *local_68;
  char *local_60;
  char *wptr [4];
  
  config = cmd_ln_parse_r((ps_config_t *)0x0,ps_args_def,argc,argv,1);
  if ((config == (cmd_ln_t *)0x0) ||
     ((pcVar5 = ps_config_str(config,"argfile"), pcVar5 != (char *)0x0 &&
      (config = cmd_ln_parse_file_r(config,ps_args_def,pcVar5,0), config == (cmd_ln_t *)0x0)))) {
    err_set_loglevel(ERR_INFO);
    cmd_ln_log_help_r((ps_config_t *)0x0,ps_args_def);
    return 1;
  }
  pcVar5 = ps_config_str(config,"ctl");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "-ctl argument not present, nothing to do in batch mode!\n";
    lVar8 = 0x3a8;
LAB_0010906c:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
            ,lVar8,pcVar5);
LAB_00109073:
    exit(1);
  }
  pFVar6 = fopen(pcVar5,"r");
  if (pFVar6 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,0x3ab,"Failed to open control file \'%s\'",pcVar5);
    goto LAB_00109073;
  }
  local_150 = pFVar6;
  ps_default_search_args(config);
  ps = ps_init(config);
  if (ps == (ps_decoder_t *)0x0) {
    ps_config_free(config);
    fclose(local_150);
    pcVar5 = "PocketSphinx decoder init failed\n";
    lVar8 = 0x3b2;
    goto LAB_0010906c;
  }
  local_a8 = ps_config_int(config,"ctloffset");
  local_b8 = ps_config_int(config,"ctlcount");
  local_b0 = ps_config_int(config,"ctlincr");
  pcVar5 = ps_config_str(config,"outlatdir");
  pcVar7 = ps_config_str(config,"nbestdir");
  lVar8 = ps_config_int(config,"frate");
  pcVar9 = ps_config_str(config,"mllrctl");
  if (pcVar9 != (char *)0x0) {
    pFVar6 = fopen(pcVar9,"r");
    if (pFVar6 != (FILE *)0x0) goto LAB_00107767;
    pcVar5 = "Failed to open MLLR control file file %s";
    lVar8 = 0x2c2;
LAB_00107805:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,lVar8,pcVar5,pcVar9);
    pFVar11 = local_150;
    goto LAB_00108fdc;
  }
  pFVar6 = (FILE *)0x0;
LAB_00107767:
  local_68 = pFVar6;
  pcVar9 = ps_config_str(config,"fsgctl");
  if (pcVar9 == (char *)0x0) {
    pFVar6 = (FILE *)0x0;
  }
  else {
    pFVar6 = fopen(pcVar9,"r");
    if (pFVar6 == (FILE *)0x0) {
      pcVar5 = "Failed to open FSG control file file %s";
      lVar8 = 0x2c9;
      goto LAB_00107805;
    }
  }
  local_128 = pcVar7;
  local_70 = pFVar6;
  pcVar9 = ps_config_str(config,"alignctl");
  if (pcVar9 == (char *)0x0) {
    pFVar6 = (FILE *)0x0;
  }
  else {
    pFVar6 = fopen(pcVar9,"r");
    if (pFVar6 == (FILE *)0x0) {
      pcVar5 = "Failed to open alignment control file file %s";
      lVar8 = 0x2d0;
      goto LAB_00107805;
    }
  }
  pcVar7 = ps_config_str(config,"lmnamectl");
  if (pcVar7 != (char *)0x0) {
    pFVar10 = fopen(pcVar7,"r");
    if (pFVar10 != (FILE *)0x0) goto LAB_00107864;
    pcVar5 = "Failed to open LM name control file file %s";
    lVar8 = 0x2d7;
LAB_00107968:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,lVar8,pcVar5,pcVar7);
    pFVar11 = local_150;
    goto LAB_00108fcf;
  }
  pFVar10 = (FILE *)0x0;
LAB_00107864:
  local_c0 = pcVar5;
  local_78 = pFVar10;
  pcVar7 = ps_config_str(config,"hyp");
  if (pcVar7 == (char *)0x0) {
    pFVar10 = (FILE *)0x0;
  }
  else {
    pFVar10 = fopen(pcVar7,"w");
    if (pFVar10 == (FILE *)0x0) {
      pcVar5 = "Failed to open hypothesis file %s for writing";
      lVar8 = 0x2de;
      goto LAB_00107968;
    }
    setbuf(pFVar10,(char *)0x0);
  }
  pcVar5 = ps_config_str(config,"hypseg");
  if (pcVar5 == (char *)0x0) {
    local_130 = (FILE *)0x0;
  }
  else {
    pFVar11 = fopen(pcVar5,"w");
    if (pFVar11 == (FILE *)0x0) {
      local_108 = (FILE *)0x0;
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                     ,0x2e6,"Failed to open hypothesis file %s for writing",pcVar5);
      __stream = (FILE *)0x0;
      pFVar11 = local_150;
      goto LAB_00108fa0;
    }
    local_130 = pFVar11;
    setbuf(pFVar11,(char *)0x0);
  }
  pcVar5 = ps_config_str(config,"ctm");
  local_100 = pFVar6;
  if (pcVar5 == (char *)0x0) {
    local_108 = (FILE *)0x0;
    local_110 = pFVar10;
  }
  else {
    local_108 = fopen(pcVar5,"w");
    if (local_108 == (FILE *)0x0) {
      local_108 = (FILE *)0x0;
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                     ,0x2ee,"Failed to open hypothesis file %s for writing",pcVar5);
      __stream = local_130;
      pFVar11 = local_150;
      goto LAB_00108fa0;
    }
    local_110 = pFVar10;
    setbuf(local_108,(char *)0x0);
  }
  local_cc = (int)local_a8 + (int)local_b8;
  local_88 = (double)(int)lVar8;
  local_148 = 0;
  pFVar11 = local_150;
LAB_001079c9:
  do {
    local_f8 = fread_line((FILE *)pFVar11,&len);
    if (local_f8 == (char *)0x0) goto LAB_00108e78;
    if (local_68 != (FILE *)0x0) {
      pcVar5 = fread_line((FILE *)local_68,&len);
      if (pcVar5 != (char *)0x0) {
        pcVar7 = string_trim(pcVar5,STRING_BOTH);
        goto LAB_00107a1c;
      }
      pcVar5 = "File size mismatch between control and MLLR control\n";
      lVar8 = 0x2ff;
LAB_00108f6e:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,lVar8,pcVar5);
      ckd_free(local_f8);
      ckd_free((void *)0x0);
      pFVar10 = local_110;
      __stream = local_130;
      pFVar6 = local_100;
      goto LAB_00108fa0;
    }
    pcVar5 = (char *)0x0;
    pcVar7 = (char *)0x0;
LAB_00107a1c:
    local_60 = pcVar5;
    if (local_78 == (FILE *)0x0) {
      local_98 = (char *)0x0;
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = fread_line((FILE *)local_78,&len);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "File size mismatch between control and LM control\n";
        lVar8 = 0x309;
        goto LAB_00108f6e;
      }
      local_98 = pcVar5;
      pcVar5 = string_trim(pcVar5,STRING_BOTH);
    }
    if (local_70 == (FILE *)0x0) {
      local_a0 = (char *)0x0;
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = fread_line((FILE *)local_70,&len);
      if (pcVar9 == (char *)0x0) {
        pcVar5 = "File size mismatch between control and FSG control\n";
        lVar8 = 0x313;
        goto LAB_00108f6e;
      }
      local_a0 = pcVar9;
      pcVar9 = string_trim(pcVar9,STRING_BOTH);
    }
    if (local_100 == (FILE *)0x0) {
      pcVar12 = (char *)0x0;
      pcVar13 = (char *)0x0;
    }
    else {
      pcVar12 = fread_line((FILE *)local_100,&len);
      if (pcVar12 == (char *)0x0) {
        pcVar5 = "File size mismatch between control and align control\n";
        lVar8 = 0x31d;
        goto LAB_00108f6e;
      }
      pcVar13 = string_trim(pcVar12,STRING_BOTH);
    }
    if ((int)local_148 < (int)local_a8) {
      local_148 = local_148 + (int)local_b0;
      goto LAB_00107bd5;
    }
    if (((int)local_b8 != -1) && (local_cc <= (int)local_148)) goto LAB_00107bd5;
    local_80 = pcVar12;
    uVar2 = str2words(local_f8,wptr,4);
    if (uVar2 == 0) goto LAB_00107bb9;
    if ((int)uVar2 < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,0x334,"Unexpected extra data in control file at line %d\n",(ulong)local_148);
      goto LAB_00107bb9;
    }
    local_160 = (FILE *)wptr[0];
    local_158 = (float32 **)((ulong)local_158 & 0xffffffff00000000);
    iVar3 = -1;
    if (uVar2 != 1) {
      iVar3 = atoi(wptr[1]);
      local_158 = (float32 **)CONCAT44(local_158._4_4_,iVar3);
      if (uVar2 < 3) {
        iVar3 = -1;
      }
      else {
        iVar3 = atoi(wptr[2]);
      }
    }
    local_170 = (double)CONCAT44(local_170._4_4_,iVar3);
    pFVar6 = local_160;
    if (3 < uVar2) {
      pFVar6 = (FILE *)wptr[3];
    }
    local_138 = pcVar13;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
            ,0x344,"Decoding \'%s\'\n",pFVar6);
    pcVar12 = process_mllrctl_line_lastfile;
    local_168 = pFVar6;
    if ((pcVar7 != (char *)0x0) &&
       ((process_mllrctl_line_lastfile == (char *)0x0 ||
        (iVar3 = strcmp(pcVar7,process_mllrctl_line_lastfile), iVar3 != 0)))) {
      ckd_free(pcVar12);
      process_mllrctl_line_lastfile =
           __ckd_salloc__(pcVar7,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                          ,0x104);
      pcVar12 = ps_config_str(config,"mllrext");
      pcVar13 = ps_config_str(config,"mllrdir");
      if (pcVar13 == (char *)0x0) {
        if (pcVar12 == (char *)0x0) {
          plVar14 = (logmath_t *)
                    __ckd_salloc__(pcVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                   ,0x10d);
        }
        else {
          plVar14 = (logmath_t *)string_join(pcVar7,pcVar12,0);
        }
      }
      else {
        if (pcVar12 == (char *)0x0) {
          pcVar12 = "";
        }
        plVar14 = (logmath_t *)string_join(pcVar13,"/",pcVar7,pcVar12,0);
      }
      mllr = ps_mllr_read((char *)plVar14);
      if (mllr != (ps_mllr_t *)0x0) {
        ppVar15 = ps_update_mllr(ps,mllr);
        if (ppVar15 != (ps_mllr_t *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,0x119,"Using MLLR: %s\n",pcVar7);
          ckd_free(plVar14);
          goto LAB_00107d76;
        }
        ps_mllr_free(mllr);
      }
      goto LAB_001080a3;
    }
LAB_00107d76:
    if (pcVar5 != (char *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,0x14f,"Using language model: %s\n",pcVar5);
      iVar3 = ps_activate_search(ps,pcVar5);
      if (iVar3 != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                ,0x151,"No such language model: %s\n",pcVar5);
        pFVar11 = local_150;
        goto LAB_001079c9;
      }
    }
    pcVar5 = ps_config_str(config,"fsgdir");
    pcVar7 = ps_config_str(config,"fsgext");
    if (pcVar9 == (char *)0x0) break;
    if (pcVar5 == (char *)0x0) {
      if (pcVar7 == (char *)0x0) {
        plVar14 = (logmath_t *)
                  __ckd_salloc__(pcVar9,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                 ,0x12f);
      }
      else {
        plVar14 = (logmath_t *)string_join(pcVar9,pcVar7,0);
      }
    }
    else {
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      plVar14 = (logmath_t *)string_join(pcVar5,"/",pcVar9,pcVar7,0);
    }
    lmath = ps_get_logmath(ps);
    dVar22 = ps_config_float(config,"lw");
    fsg = fsg_model_readfile((char *)plVar14,lmath,(float32)(float)dVar22);
    if ((fsg == (fsg_model_t *)0x0) || (iVar3 = ps_add_fsg(ps,pcVar9,fsg), iVar3 != 0)) {
      fsg_model_free(fsg);
      goto LAB_001080a3;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
            ,0x13d,"Using FSG: %s\n",pcVar9);
    iVar3 = ps_activate_search(ps,pcVar9);
    fsg_model_free(fsg);
    ckd_free(plVar14);
    pFVar11 = local_150;
  } while (iVar3 != 0);
  pcVar5 = ps_config_str(config,"aligndir");
  pcVar7 = ps_config_str(config,"alignext");
  if (local_138 == (char *)0x0) goto LAB_001080fd;
  if (pcVar5 == (char *)0x0) {
    if (pcVar7 == (char *)0x0) {
      pcVar5 = __ckd_salloc__(local_138,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                              ,0x16a);
    }
    else {
      pcVar5 = string_join(local_138,pcVar7,0);
    }
  }
  else {
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    pcVar5 = string_join(pcVar5,"/",local_138,pcVar7,0);
  }
  pFVar6 = fopen(pcVar5,"r");
  if (pFVar6 == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,0x16d,"Failed to open transcript file %s",pcVar5);
    plVar14 = (logmath_t *)0x0;
  }
  else {
    fseek(pFVar6,0,2);
    sVar16 = ftell(pFVar6);
    plVar14 = (logmath_t *)
              __ckd_calloc__(sVar16 + 1,1,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                             ,0x173);
    fseek(pFVar6,0,0);
    sVar17 = fread(plVar14,1,sVar16,pFVar6);
    if (sVar17 == sVar16) {
      iVar3 = fclose(pFVar6);
      if (iVar3 == 0) {
        iVar3 = ps_set_align_text(ps,(char *)plVar14);
        if (iVar3 != 0) goto LAB_00108098;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                ,0x182,"Force-aligning with transcript from: %s\n",local_138);
        ckd_free(pcVar5);
        ckd_free(plVar14);
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                       ,0x17b,"Failed to close transcript file %s",pcVar5);
        ckd_free(pcVar5);
        ckd_free(plVar14);
        pFVar11 = local_150;
        if (iVar3 < 0) goto LAB_001079c9;
      }
LAB_001080fd:
      iVar3 = local_170._0_4_ - (int)local_158;
      if (local_170._0_4_ < (int)local_158 && local_170._0_4_ != -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                ,0x1b1,"End frame %d is < start frame %d\n");
        pFVar11 = local_150;
        goto LAB_001079c9;
      }
      pcVar5 = ps_config_str(config,"cepdir");
      pcVar7 = ps_config_str(config,"cepext");
      pFVar6 = local_160;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "";
      }
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      plVar14 = (logmath_t *)string_join(pcVar5,"/",local_160,pcVar7,0);
      pFVar10 = local_168;
      if (local_168 != (FILE *)0x0) {
        pFVar6 = local_168;
      }
      local_160 = fopen((char *)plVar14,"rb");
      if (local_160 == (FILE *)0x0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                       ,0x1bf,"Failed to open %s",plVar14);
        goto LAB_001080a3;
      }
      local_120 = plVar14;
      iVar4 = ps_config_bool(config,"build_outdirs");
      if (iVar4 != 0) {
        pcVar5 = __ckd_salloc__((char *)pFVar6,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                ,0x19b);
        path2dirname((char *)pFVar6,pcVar5);
        build_outdir_one(config,"outlatdir",pcVar5);
        build_outdir_one(config,"mfclogdir",pcVar5);
        build_outdir_one(config,"rawlogdir",pcVar5);
        build_outdir_one(config,"senlogdir",pcVar5);
        build_outdir_one(config,"nbestdir",pcVar5);
        pFVar10 = local_168;
        ckd_free(pcVar5);
      }
      iVar4 = ps_config_bool(config,"senin");
      pcVar5 = local_128;
      pFVar6 = local_160;
      if (iVar4 == 0) {
        iVar4 = ps_config_bool(config,"adcin");
        pFVar6 = local_160;
        if (iVar4 == 0) {
          lVar8 = ps_config_int(config,"ceplen");
          fseek(pFVar6,0,2);
          lVar18 = ftell(pFVar6);
          fseek(pFVar6,0,0);
          sVar16 = fread(&sf,4,1,pFVar6);
          if (sVar16 == 1) {
            local_140 = (char *)(long)sf;
            pcVar5 = (char *)(lVar18 / 4 + -1);
            uVar2 = sf;
            if ((pcVar5 == local_140) ||
               (uVar2 = (uint)sf >> 0x18 | (sf & 0xff0000U) >> 8 | (sf & 0xff00U) << 8 | sf << 0x18,
               pcVar5 == (char *)(long)(int)uVar2)) {
              if (uVar2 == 0) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                        ,0xde,"Empty mfcc file\n");
                pFVar6 = local_160;
              }
              else {
                iVar4 = (int)lVar8;
                fseek(local_160,(long)((int)local_158 * iVar4 * 4),1);
                iVar3 = local_170._0_4_;
                if (local_170._0_4_ == -1) {
                  iVar3 = (int)uVar2 / iVar4;
                }
                iVar3 = iVar3 - (int)local_158;
                local_90 = (size_t)iVar3;
                local_158 = (float32 **)
                            __ckd_calloc_2d__(local_90,(long)iVar4,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                              ,0xe6);
                __ptr = *local_158;
                local_170 = (double)CONCAT44(local_170._4_4_,iVar3);
                uVar2 = iVar3 * iVar4;
                sVar16 = fread(__ptr,4,(long)(int)uVar2,local_160);
                if (sVar16 == (long)iVar4 * local_90) {
                  if (pcVar5 != local_140) {
                    if ((int)uVar2 < 1) {
                      uVar2 = 0;
                    }
                    for (uVar21 = 0; uVar2 != uVar21; uVar21 = uVar21 + 1) {
                      fVar1 = __ptr[uVar21];
                      __ptr[uVar21] =
                           (float32)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 |
                                     ((uint)fVar1 & 0xff00) << 8 | (int)fVar1 << 0x18);
                    }
                  }
                  ps_start_utt(ps);
                  tmpptr = local_158;
                  ps_process_cep(ps,local_158,local_170._0_4_,0,1);
                  ps_end_utt(ps);
                  ckd_free_2d(tmpptr);
                  pFVar6 = local_160;
                  pcVar5 = local_128;
                  pFVar10 = local_168;
                  goto LAB_001083f3;
                }
                err_msg_system(ERR_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                               ,0xe9,"Failed to read %d items from mfcfile");
                ckd_free_2d(local_158);
                pFVar6 = local_160;
              }
            }
            else {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                      ,0xd8,"File length mismatch: 0x%x != 0x%x, maybe it\'s not MFCC file\n",
                      (ulong)uVar2,pcVar5);
              pFVar6 = local_160;
            }
          }
          else {
            err_msg_system(ERR_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                           ,0xcf,"Failed to read 4 bytes from MFCC file");
          }
          plVar14 = local_120;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,0x1e0,"Failed to read MFCC from the file \'%s\'\n",local_120);
          fclose(pFVar6);
          goto LAB_001080a3;
        }
        lVar8 = -1;
        if (local_170._0_4_ != -1) {
          local_140 = (char *)(double)iVar3;
          lVar8 = ps_config_int(config,"samprate");
          local_170 = (double)lVar8;
          lVar8 = ps_config_int(config,"frate");
          local_170 = (local_170 / (double)lVar8) * (double)local_140;
          lVar8 = ps_config_int(config,"samprate");
          local_140 = (char *)(double)lVar8;
          dVar22 = ps_config_float(config,"wlen");
          lVar8 = (long)(int)(dVar22 * (double)local_140 + local_170);
        }
        local_158 = (float32 **)(double)(int)local_158;
        lVar18 = ps_config_int(config,"samprate");
        local_170 = (double)lVar18;
        lVar18 = ps_config_int(config,"frate");
        dVar22 = (local_170 / (double)lVar18) * (double)local_158;
        lVar18 = ps_config_int(config,"adchdr");
        fseek(pFVar6,lVar18 + (long)(int)dVar22 * 2,0);
        ps_decode_raw(ps,(FILE *)pFVar6,lVar8);
        pFVar10 = local_168;
      }
      else {
        ps_decode_senscr(ps,(FILE *)local_160);
      }
LAB_001083f3:
      fclose(pFVar6);
      ckd_free(local_120);
      if (local_110 == (FILE *)0x0) {
LAB_00108709:
        local_140 = (char *)0x0;
      }
      else {
        pcVar7 = ps_get_hyp(ps,(int32 *)&local_114);
        if (local_138 != (char *)0x0) {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = __ckd_salloc__("",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                    ,0x291);
          }
          else {
            ppVar19 = ps_seg_iter(ps);
            iVar3 = 0;
            for (; ppVar19 != (ps_seg_t *)0x0; ppVar19 = ps_seg_next(ppVar19)) {
              if (-1 < ppVar19->wid) {
                sVar16 = strlen(ppVar19->text);
                iVar3 = iVar3 + (int)sVar16 + 1;
              }
            }
            if (iVar3 == 0) {
              pcVar7 = __ckd_salloc__("",
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                      ,0x29b);
              pFVar10 = local_168;
            }
            else {
              pcVar7 = (char *)__ckd_malloc__((long)iVar3,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                              ,0x29c);
              ppVar19 = ps_seg_iter(ps);
              pFVar10 = local_168;
              pcVar9 = pcVar7;
              for (; ppVar19 != (ps_seg_t *)0x0; ppVar19 = ps_seg_next(ppVar19)) {
                if (-1 < ppVar19->wid) {
                  pcVar12 = ppVar19->text;
                  sVar16 = strlen(pcVar12);
                  pcVar5 = local_128;
                  memcpy(pcVar9,pcVar12,(long)(int)sVar16);
                  pcVar12 = pcVar9 + (int)sVar16;
                  pcVar9 = pcVar12 + 1;
                  *pcVar12 = ' ';
                  pFVar10 = local_168;
                }
              }
              pcVar9[-1] = '\0';
            }
          }
          fprintf(local_110,"%s (%s %d)\n",pcVar7,pFVar10,(ulong)local_114);
          ckd_free(pcVar7);
          goto LAB_00108709;
        }
        pcVar9 = pcVar7;
        if (pcVar7 == (char *)0x0) {
          pcVar9 = "";
        }
        local_140 = pcVar7;
        fprintf(local_110,"%s (%s %d)\n",pcVar9,pFVar10,(ulong)local_114);
      }
      if (local_130 != (FILE *)0x0) {
        ppVar19 = ps_seg_iter(ps);
        iVar3 = 0;
        uVar2 = 0;
        for (; ppVar19 != (ps_seg_t *)0x0; ppVar19 = ps_seg_next(ppVar19)) {
          ps_seg_prob(ppVar19,&sf,&ef,(int32 *)0x0);
          iVar3 = iVar3 + ef;
          uVar2 = uVar2 + sf;
        }
        fprintf(local_130,"%s S %d T %d A %d L %d",local_168,0,(ulong)(uVar2 + iVar3),(ulong)uVar2,
                iVar3);
        for (ppVar19 = ps_seg_iter(ps); ppVar19 != (ps_seg_t *)0x0; ppVar19 = ps_seg_next(ppVar19))
        {
          pcVar7 = ps_seg_word(ppVar19);
          ps_seg_prob(ppVar19,&ascr,(int32 *)&local_c8,(int32 *)0x0);
          ps_seg_frames(ppVar19,&sf,&ef);
          fprintf(local_130," %d %d %d %s",(ulong)(uint)sf,(ulong)(uint)ascr,(ulong)local_c8,pcVar7)
          ;
        }
        fprintf(local_130," %d\n",(ulong)(uint)ef);
      }
      if (local_108 != (FILE *)0x0) {
        ppVar19 = ps_seg_iter(ps);
        local_120 = ps_get_logmath(ps);
        pcVar5 = (char *)local_168;
        if (local_168 == (FILE *)0x0) {
          pcVar5 = "(null)";
        }
        local_138 = __ckd_salloc__(pcVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                   ,0x25e);
        pcVar5 = strchr(local_138,0x2c);
        local_170 = 0.0;
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
          pcVar5 = strchr(pcVar5 + 1,0x2c);
          if (pcVar5 != (char *)0x0) {
            *pcVar5 = '\0';
            pcVar5 = strchr(pcVar5 + 1,0x2c);
            if (pcVar5 != (char *)0x0) {
              local_170 = atof_c(pcVar5 + 1);
            }
          }
        }
        for (; ppVar19 != (ps_seg_t *)0x0; ppVar19 = ps_seg_next(ppVar19)) {
          pcVar5 = ps_seg_word(ppVar19);
          w = dict_wordid(ps->dict,pcVar5);
          if ((-1 < w) && (iVar3 = dict_real_word(ps->dict,w), iVar3 != 0)) {
            logb_p = ps_seg_prob(ppVar19,(int32 *)0x0,(int32 *)0x0,(int32 *)0x0);
            ps_seg_frames(ppVar19,&sf,&ef);
            local_160 = (FILE *)((double)sf / local_88 + local_170);
            local_158 = (float32 **)((double)(ef - sf) / local_88);
            fVar23 = logmath_exp(local_120,logb_p);
            fprintf(local_108,"%s %s %.2f %.2f %s %.3f\n",local_160,local_158,fVar23,local_138);
          }
        }
        ckd_free(local_138);
        pcVar5 = local_128;
      }
      if (local_c0 != (char *)0x0) {
        dag = ps_get_lattice(ps);
        if (dag == (ps_lattice_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,0x1f9,"Failed to obtain word lattice for utterance %s\n",local_168);
          pcVar5 = local_128;
        }
        else {
          ppVar20 = ps_get_config(ps);
          pcVar5 = ps_config_str(ppVar20,"outlatext");
          pcVar7 = string_join(local_c0,"/",local_168,pcVar5,0);
          plVar14 = ps_get_logmath(ps);
          dVar22 = ps_config_float(ppVar20,"outlatbeam");
          iVar3 = logmath_log(plVar14,(float64)dVar22);
          ps_lattice_posterior_prune(dag,iVar3);
          pcVar5 = ps_config_str(ppVar20,"outlatfmt");
          iVar3 = strcmp("htk",pcVar5);
          if (iVar3 == 0) {
            iVar3 = ps_lattice_write_htk(dag,pcVar7);
            pcVar5 = local_128;
            if (-1 < iVar3) goto LAB_00108b17;
            lVar8 = 0x205;
          }
          else {
            iVar3 = ps_lattice_write(dag,pcVar7);
            pcVar5 = local_128;
            if (-1 < iVar3) goto LAB_00108b17;
            lVar8 = 0x20b;
          }
          pcVar5 = local_128;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,lVar8,"Failed to write lattice to %s\n",pcVar7);
        }
      }
LAB_00108b17:
      if (pcVar5 != (char *)0x0) {
        ppVar20 = ps_get_config(ps);
        pcVar5 = ps_config_str(ppVar20,"nbestext");
        pcVar5 = string_join(local_128,"/",local_168,pcVar5,0);
        lVar8 = ps_config_int(ppVar20,"nbest");
        pFVar6 = fopen(pcVar5,"w");
        if (pFVar6 == (FILE *)0x0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                         ,0x222,"Failed to write a lattice to file %s\n",pcVar5);
        }
        else {
          nbest = ps_nbest(ps);
          iVar3 = 0;
          while ((iVar3 < (int)lVar8 && (nbest != (ps_nbest_t *)0x0))) {
            nbest = ps_nbest_next(nbest);
            if (nbest == (ps_nbest_t *)0x0) goto LAB_00108c0a;
            pcVar5 = ps_nbest_hyp(nbest,&sf);
            fprintf(pFVar6,"%s %d\n",pcVar5,(ulong)(uint)sf);
            iVar3 = iVar3 + 1;
          }
          if (nbest != (ps_nbest_t *)0x0) {
            ps_nbest_free(nbest);
          }
LAB_00108c0a:
          fclose(pFVar6);
        }
      }
      ps_get_utt_time(ps,&n_speech,&n_cpu,&n_wall);
      pFVar6 = local_168;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,0x370,"%s: %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",n_speech,n_cpu
              ,n_wall,local_168);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,0x372,"%s: %.2f xRT (CPU), %.2f xRT (elapsed)\n",n_cpu / n_speech,n_wall / n_speech,
              pFVar6);
      pcVar5 = local_140;
      if (local_140 == (char *)0x0) {
        pcVar5 = "";
      }
      err_msg(ERR_INFO,(char *)0x0,0,"%s (%s %d)\n",pcVar5,pFVar6,local_114);
      err_msg(ERR_INFO,(char *)0x0,0,"%s done --------------------------------------\n",pFVar6);
LAB_00107bb9:
      local_148 = local_148 + (int)local_b0;
      pcVar12 = local_80;
      pFVar11 = local_150;
LAB_00107bd5:
      ckd_free(pcVar12);
      ckd_free(local_60);
      ckd_free(local_a0);
      ckd_free(local_98);
      ckd_free(local_f8);
      goto LAB_001079c9;
    }
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,0x176,"Failed to fully read transcript file %s",pcVar5);
  }
LAB_00108098:
  ckd_free(pcVar5);
LAB_001080a3:
  ckd_free(plVar14);
  pFVar11 = local_150;
  goto LAB_001079c9;
LAB_00108e78:
  ps_get_all_time(ps,&n_speech,&n_cpu,&n_wall);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
          ,0x382,"TOTAL %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",n_speech,n_cpu,
          n_wall);
  pFVar11 = local_150;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
          ,900,"AVERAGE %.2f xRT (CPU), %.2f xRT (elapsed)\n",n_cpu / n_speech,n_wall / n_speech);
  pFVar10 = local_110;
  __stream = local_130;
  pFVar6 = local_100;
LAB_00108fa0:
  if (pFVar10 != (FILE *)0x0) {
    fclose(pFVar10);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (local_108 != (FILE *)0x0) {
    fclose(local_108);
  }
LAB_00108fcf:
  if (pFVar6 != (FILE *)0x0) {
    fclose(pFVar6);
  }
LAB_00108fdc:
  fclose(pFVar11);
  ps_free(ps);
  ps_config_free(config);
  return 0;
}

Assistant:

int
main(int32 argc, char *argv[])
{
    ps_decoder_t *ps;
    cmd_ln_t *config;
    char const *ctl;
    FILE *ctlfh;

    config = cmd_ln_parse_r(NULL, ps_args_def, argc, argv, TRUE);

    /* Handle argument file as -argfile. */
    if (config && (ctl = ps_config_str(config, "argfile")) != NULL) {
        config = cmd_ln_parse_file_r(config, ps_args_def, ctl, FALSE);
    }
    
    if (config == NULL) {
        /* This probably just means that we got no arguments. */
        err_set_loglevel(ERR_INFO);
        cmd_ln_log_help_r(NULL, ps_args_def);
        return 1;
    }

    if ((ctl = ps_config_str(config, "ctl")) == NULL) {
        E_FATAL("-ctl argument not present, nothing to do in batch mode!\n");
    }
    if ((ctlfh = fopen(ctl, "r")) == NULL) {
        E_FATAL_SYSTEM("Failed to open control file '%s'", ctl);
    }

    ps_default_search_args(config);
    if (!(ps = ps_init(config))) {
        ps_config_free(config);
        fclose(ctlfh);
        E_FATAL("PocketSphinx decoder init failed\n");
    }

    process_ctl(ps, config, ctlfh);

    fclose(ctlfh);
    ps_free(ps);
    ps_config_free(config);
    return 0;
}